

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O3

void AddPathDelimiter(tchar_t *Path,size_t PathLen)

{
  size_t sVar1;
  
  sVar1 = strlen(Path);
  if ((sVar1 != 0) && (Path[sVar1 - 1] == '/')) {
    return;
  }
  tcscat_s(Path,PathLen,"/");
  return;
}

Assistant:

void AddPathDelimiter(tchar_t* Path,size_t PathLen)
{
    size_t n = tcslen(Path);
#if defined(TARGET_WIN)
    bool_t HasProtocol = GetProtocol(Path,NULL,0,NULL)==Path;
    if (!n || (n>0 && (HasProtocol || Path[n-1] != '/') && (!HasProtocol || Path[n-1] != '\\')))
    {
        if (HasProtocol)
            tcscat_s(Path,PathLen,T("\\"));
        else
            tcscat_s(Path,PathLen,T("/"));
    }
#else
    if (!n || (n>0 && Path[n-1] != '/'))
        tcscat_s(Path,PathLen,T("/"));
#endif
}